

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.cpp
# Opt level: O2

string * __thiscall FIX::FieldMap::calculateString(FieldMap *this,string *result)

{
  pointer pFVar1;
  _Base_ptr p_Var2;
  const_iterator cVar3;
  FieldMap **group;
  _Base_ptr p_Var4;
  FieldBase *field;
  pointer this_00;
  int local_44;
  _Base_ptr local_40;
  Groups *local_38;
  
  pFVar1 = (this->m_fields).super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_38 = &this->m_groups;
  local_40 = &(this->m_groups)._M_t._M_impl.super__Rb_tree_header._M_header;
  for (this_00 = (this->m_fields).
                 super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
                 super__Vector_impl_data._M_start; this_00 != pFVar1; this_00 = this_00 + 1) {
    FieldBase::getFixString_abi_cxx11_(this_00);
    std::__cxx11::string::append((string *)result);
    if ((this->m_groups)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      local_44 = this_00->m_tag;
      cVar3 = std::
              _Rb_tree<int,_std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>_>
              ::find(&local_38->_M_t,&local_44);
      if (cVar3._M_node != local_40) {
        p_Var2 = cVar3._M_node[1]._M_left;
        for (p_Var4 = cVar3._M_node[1]._M_parent; p_Var4 != p_Var2;
            p_Var4 = (_Base_ptr)&p_Var4->_M_parent) {
          calculateString(*(FieldMap **)p_Var4,result);
        }
      }
    }
  }
  return result;
}

Assistant:

std::string &FieldMap::calculateString(std::string &result) const {
  for (auto const &field : m_fields) {
    result += field.getFixString();

    // add groups if they exist
    if (!m_groups.size()) {
      continue;
    }

    Groups::const_iterator tagWithGroups = m_groups.find(field.getTag());
    if (tagWithGroups == m_groups.end()) {
      continue;
    }

    for (auto const &group : tagWithGroups->second) {
      group->calculateString(result);
    }
  }
  return result;
}